

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parseFile_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  char cVar6;
  string *this_00;
  string *this_01;
  string local_48;
  
  this_00 = &local_48;
  this_01 = &local_48;
  peVar2 = (object->super___shared_ptr<TgBot::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar2 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar6 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar6);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"file_id","");
    appendToJson((TgTypeParser *)this_00,__return_storage_ptr__,&local_48,
                 &((object->super___shared_ptr<TgBot::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  fileId);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"file_size","");
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"file_path","");
    appendToJson((TgTypeParser *)this_01,__return_storage_ptr__,&local_48,
                 &((object->super___shared_ptr<TgBot::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  filePath);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    sVar5 = __return_storage_ptr__->_M_string_length - 1;
    if (__return_storage_ptr__->_M_string_length == 0) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar3);
      }
      _Unwind_Resume(uVar4);
    }
    __return_storage_ptr__->_M_string_length = sVar5;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar5] = '\0';
    std::__cxx11::string::push_back(cVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseFile(const File::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "file_id", object->fileId);
    appendToJson(result, "file_size", object->fileSize);
    appendToJson(result, "file_path", object->filePath);
    removeLastComma(result);
    result += '}';
    return result;
}